

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

error_info *
toml::make_error_info<toml::source_location,char_const(&)[31]>
          (string *title,source_location *loc,string *msg,source_location *tail,char (*tail_1) [31])

{
  error_info *in_RCX;
  error_info *in_RDX;
  error_info *in_RDI;
  error_info ei;
  source_location *in_stack_fffffffffffffd58;
  source_location *in_stack_fffffffffffffd60;
  source_location *this;
  allocator<char> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffe68;
  source_location *in_stack_fffffffffffffe70;
  error_info *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  source_location *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  error_info *in_stack_fffffffffffffeb0;
  
  std::__cxx11::string::string(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  source_location::source_location(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::__cxx11::string::string(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  error_info::error_info
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60);
  source_location::~source_location(in_stack_fffffffffffffd60);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60);
  error_info::error_info(in_RCX,in_RDX);
  source_location::source_location(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  this = (source_location *)&stack0xfffffffffffffd97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  detail::make_error_info_rec<>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd97);
  source_location::~source_location(this);
  error_info::~error_info((error_info *)this);
  error_info::~error_info((error_info *)this);
  return in_RDI;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}